

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O1

ssize_t __thiscall
TCPController::recv(TCPController *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  _Hash_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Ethernet *pEVar3;
  int iVar4;
  ssize_t sVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  TCPConnection *this_01;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  bool bVar12;
  int fd;
  uint8_t *data;
  int local_40;
  ushort local_3a;
  Ethernet *local_38;
  uint local_2c;
  NetworkDevice *local_28;
  
  sVar5 = IPController::recv((IPController *)&local_38,(int)this->ip_ctrl,__buf,__n,__flags);
  pEVar3 = local_38;
  if (local_38 == (Ethernet *)0x0) {
    return sVar5;
  }
  if (local_28 == (NetworkDevice *)0x0) {
    return sVar5;
  }
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  uVar1 = *(ushort *)((long)&pEVar3->_vptr_Ethernet + 2);
  local_3a = uVar1 << 8 | uVar1 >> 8;
  pmVar6 = std::__detail::
           _Map_base<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->port_fd_map,&local_3a);
  local_40 = *pmVar6;
  uVar9 = (this->connections)._M_h._M_bucket_count;
  p_Var10 = (this->connections)._M_h._M_buckets[(ulong)(long)local_40 % uVar9];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var10->_M_nxt, p_Var11 = p_Var10, local_40 != *(int *)&p_Var10->_M_nxt[1]._M_nxt))
  {
    while (p_Var10 = p_Var2, p_Var2 = p_Var10->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar9 != (ulong)(long)local_40 % uVar9) ||
         (p_Var11 = p_Var10, local_40 == *(int *)&p_Var2[1]._M_nxt)) goto LAB_00108143;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00108143:
  if (p_Var11 == (__node_base_ptr)0x0) {
    bVar12 = true;
  }
  else {
    bVar12 = p_Var11->_M_nxt == (_Hash_node_base *)0x0;
  }
  if (bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"not found port",0xe);
    iVar4 = (int)uVar9;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    this_01 = &this->dummy_connection;
  }
  else {
    pmVar8 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->connections,&local_40);
    iVar4 = (int)uVar9;
    this_01 = (pmVar8->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (pmVar8->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)this);
      sVar5 = TCPConnection::recv(this_01,(int)local_38,local_28,(ulong)local_2c,iVar4);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        sVar5 = extraout_RAX;
      }
      goto LAB_00108247;
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  sVar5 = TCPConnection::recv(this_01,(int)local_38,local_28,(ulong)local_2c,iVar4);
LAB_00108247:
  if (bVar12) {
    iVar4 = pthread_rwlock_unlock((pthread_rwlock_t *)this);
    sVar5 = CONCAT44(extraout_var,iVar4);
  }
  return sVar5;
}

Assistant:

void TCPController::recv() {
    auto[data, protocol, from_ip, size] = ip_ctrl.recv();
    if (data != nullptr && size != 0) {
        auto *tcp = (tcp_t *) data;
        std::shared_lock lck(mutex_);
        int fd = port_fd_map[ntohs(tcp->dst_port)];
        if (connections.find(fd) != connections.end()) {
            auto conn = connections[fd];
            lck.unlock();
            conn->recv(data, size, from_ip);
        } else {
            std::cout << "not found port" << ntohs(tcp->dst_port) << std::endl;
            dummy_connection.recv(data, size, from_ip);
        }
    }
}